

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall
kj::PausableReadAsyncIoStream::PausableRead::PausableRead
          (PausableRead *this,PromiseFulfiller<unsigned_long> *fulfiller,
          PausableReadAsyncIoStream *parent,void *buffer,size_t minBytes,size_t maxBytes)

{
  SourceLocation location;
  undefined8 node;
  Fault f;
  DebugComparison<kj::Maybe<kj::PausableReadAsyncIoStream::PausableRead_&>_&,_const_kj::None_&>
  _kjCondition;
  Fault local_78;
  undefined1 local_70 [48];
  char *pcStack_40;
  undefined8 local_38;
  PromiseFulfiller<unsigned_long> *local_30;
  
  this->fulfiller = fulfiller;
  this->parent = parent;
  this->operationBuffer = buffer;
  this->operationMinBytes = minBytes;
  this->operationMaxBytes = maxBytes;
  tryReadImpl((PausableReadAsyncIoStream *)local_70,parent,(size_t)buffer,minBytes);
  local_70._40_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_40 = "PausableRead";
  local_38 = 0x13000016a4;
  location.function = "PausableRead";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x16a4;
  location.columnNumber = 0x13;
  local_78.exception = (Exception *)fulfiller;
  local_30 = fulfiller;
  Promise<unsigned_long>::
  then<kj::PausableReadAsyncIoStream::PausableRead::PausableRead(kj::PromiseFulfiller<unsigned_long>&,kj::PausableReadAsyncIoStream&,void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_,kj::PausableReadAsyncIoStream::PausableRead::PromiseFulfiller(kj::PromiseFulfiller<unsigned_long>&,kj::PausableReadAsyncIoStream&,void*,unsigned_long,unsigned_long)::_lambda(kj::Exception&&)_1_>
            ((Promise<unsigned_long> *)&this->innerRead,(anon_class_8_1_a7efefcd_for_func *)local_70
             ,(anon_class_8_1_a7efefcd_for_errorHandler *)&local_78,location);
  node = local_70._0_8_;
  if ((PromiseArenaMember *)local_70._0_8_ != (PromiseArenaMember *)0x0) {
    local_70._0_8_ = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  local_70._0_8_ = &parent->maybePausableRead;
  local_70[0x20] = (parent->maybePausableRead).ptr == (PausableRead *)0x0;
  local_70._8_8_ = &none;
  local_70._16_8_ = " == ";
  local_70._24_8_ = &DAT_00000005;
  if ((bool)local_70[0x20]) {
    ((Maybe<kj::PausableReadAsyncIoStream::PausableRead_&> *)local_70._0_8_)->ptr = this;
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::PausableReadAsyncIoStream::PausableRead&>&,kj::None_const&>&>
            (&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x16ab,FAILED,"parent.maybePausableRead == kj::none","_kjCondition,",
             (DebugComparison<kj::Maybe<kj::PausableReadAsyncIoStream::PausableRead_&>_&,_const_kj::None_&>
              *)local_70);
  kj::_::Debug::Fault::fatal(&local_78);
}

Assistant:

PausableRead(
      kj::PromiseFulfiller<size_t>& fulfiller, PausableReadAsyncIoStream& parent,
      void* buffer, size_t minBytes, size_t maxBytes)
      : fulfiller(fulfiller), parent(parent),
        operationBuffer(buffer), operationMinBytes(minBytes), operationMaxBytes(maxBytes),
        innerRead(parent.tryReadImpl(operationBuffer, operationMinBytes, operationMaxBytes).then(
            [&fulfiller](size_t size) mutable -> kj::Promise<void> {
          fulfiller.fulfill(kj::mv(size));
          return kj::READY_NOW;
        }, [&fulfiller](kj::Exception&& err) {
          fulfiller.reject(kj::mv(err));
        })) {
    KJ_ASSERT(parent.maybePausableRead == kj::none);
    parent.maybePausableRead = *this;
  }